

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O3

int abuf_init(autobuf *autobuf)

{
  int iVar1;
  char *pcVar2;
  
  autobuf->_len = 0;
  iVar1 = getpagesize();
  pcVar2 = (char *)calloc(1,(long)iVar1);
  autobuf->_buf = pcVar2;
  if (pcVar2 == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    autobuf->_total = (long)iVar1;
    iVar1 = 0;
  }
  autobuf->_error = pcVar2 == (char *)0x0;
  return iVar1;
}

Assistant:

int
abuf_init(struct autobuf *autobuf) {
  autobuf->_len = 0;
  autobuf->_buf = calloc(1, getpagesize());
  if (autobuf->_buf == NULL) {
    autobuf->_error = true;
    return -1;
  }
  autobuf->_total = getpagesize();
  autobuf->_error = false;
  return 0;
}